

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::grow_and_add
          (FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false> *this,uint newSize,
          ExpiredCodeBlock *val)

{
  uint uVar1;
  uint uVar2;
  ExpiredCodeBlock *ptr;
  undefined4 uVar3;
  ExpiredCodeBlock *pEVar4;
  uint oldMax;
  ExpiredCodeBlock *oldData;
  ExpiredCodeBlock *val_local;
  uint newSize_local;
  FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false> *this_local;
  
  ptr = this->data;
  uVar1 = this->max;
  grow_no_destroy(this,newSize);
  uVar2 = this->count;
  this->count = uVar2 + 1;
  pEVar4 = this->data + uVar2;
  pEVar4->code = val->code;
  uVar3 = *(undefined4 *)&val->field_0xc;
  pEVar4->codeSize = val->codeSize;
  *(undefined4 *)&pEVar4->field_0xc = uVar3;
  pEVar4->unwindTable = val->unwindTable;
  if (ptr != (ExpiredCodeBlock *)0x0) {
    NULLC::destruct<ExecutorX86::ExpiredCodeBlock>(ptr,(ulong)uVar1);
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}